

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cc
# Opt level: O2

void __thiscall TlbImport::load(TlbImport *this,string *path,config_set *config,Registry *registry)

{
  ImportError *this_00;
  allocator local_299;
  string local_298 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream stream;
  int aiStack_218 [122];
  
  std::ifstream::ifstream(&stream,(path->_M_dataplus)._M_p,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(_stream + -0x18)) == 0) {
    (**(code **)((long)*this + 0x10))(this,&stream,config,registry);
    std::ifstream::~ifstream(&stream);
    return;
  }
  this_00 = (ImportError *)__cxa_allocate_exception(0x60);
  std::operator+(&local_278,"problem opening \'",path);
  std::operator+(&local_258,&local_278,"\' for import");
  std::__cxx11::string::string(local_298,"",&local_299);
  Typelib::ImportError::ImportError(this_00,(string *)&local_258,local_298,0,0);
  __cxa_throw(this_00,&Typelib::ImportError::typeinfo,Typelib::ImportError::~ImportError);
}

Assistant:

void TlbImport::load
    ( std::string const& path
    , utilmm::config_set const& config
    , Typelib::Registry& registry)
{
    // Loading from files seams to be broken on some distro's libxml2-packages,
    // so we load the whole file into memory before parsing
    std::ifstream stream(path.c_str());
    if (!stream.good())
        throw Parsing::ImportError("problem opening '"+path+"' for import");
    load(stream, config, registry);
}